

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

char * uvTypeName(VType t)

{
  undefined4 in_EDI;
  long in_FS_OFFSET;
  char *local_10;
  
  switch(in_EDI) {
  case 0:
    local_10 = "null";
    break;
  case 1:
    local_10 = "object";
    break;
  case 2:
    local_10 = "array";
    break;
  case 3:
    local_10 = "string";
    break;
  case 4:
    local_10 = "number";
    break;
  case 5:
    local_10 = "bool";
    break;
  default:
    local_10 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

const char *uvTypeName(UniValue::VType t)
{
    switch (t) {
    case UniValue::VNULL: return "null";
    case UniValue::VBOOL: return "bool";
    case UniValue::VOBJ: return "object";
    case UniValue::VARR: return "array";
    case UniValue::VSTR: return "string";
    case UniValue::VNUM: return "number";
    }

    // not reached
    return nullptr;
}